

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

char  [7] kj::_::operator*(String *param_1,Maybe<unsigned_int_&> *param_2,undefined8 param_3,
                          undefined8 param_4,StringPtr *param_5)

{
  String *params;
  ArrayPtr<const_char> local_48;
  String local_38;
  Maybe<unsigned_int_&> *local_20;
  DebugComparison<kj::Maybe<unsigned_int_&>,_const_kj::None_&> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = param_1;
  tryToCharSequence<kj::Maybe<unsigned_int&>,kj::String>((_ *)&local_38,param_2);
  params = (String *)(local_20 + 2);
  local_48 = (ArrayPtr<const_char>)tryToCharSequence(local_20[1].ptr);
  concat<kj::String,kj::StringPtr&,kj::StringPtr>
            (param_1,(_ *)&local_38,params,(StringPtr *)&local_48,param_5);
  String::~String(&local_38);
  return SUB87(param_1,0);
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}